

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_VariadicFalse_Test::
iu_SyntaxTest_x_iutest_x_VariadicFalse_Test(iu_SyntaxTest_x_iutest_x_VariadicFalse_Test *this)

{
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0039d688;
  return;
}

Assistant:

IUTEST(SyntaxTest, VariadicFalse)
{
    if( bool b = false )
        IUTEST_ASSERT_FALSE(T<0, 0>::call(b)) << b;
    if( bool b = false )
        IUTEST_EXPECT_FALSE(T<0, 0>::call(b)) << b;
    if( bool b = false )
        IUTEST_INFORM_FALSE(T<0, 0>::call(b)) << b;
    if( bool b = false )
        IUTEST_ASSUME_FALSE(T<0, 0>::call(b)) << b;
}